

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::NetParameter::SharedCtor(NetParameter *this)

{
  string *default_value;
  NetParameter *this_local;
  
  this->_cached_size_ = 0;
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->name_,default_value);
  memset(&this->state_,0,10);
  return;
}

Assistant:

void NetParameter::SharedCtor() {
  _cached_size_ = 0;
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&state_, 0, reinterpret_cast<char*>(&debug_info_) -
    reinterpret_cast<char*>(&state_) + sizeof(debug_info_));
}